

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O0

_Bool intersect_ray_tri(ray *ray,hit *hit,tri *tri)

{
  real_t rVar1;
  float fVar2;
  float x;
  float y;
  vec2 vVar3;
  vec3 b;
  vec3 a;
  real_t t;
  real_t v;
  real_t u;
  real_t inv_det;
  vec3 r;
  vec3 c;
  tri *tri_local;
  hit *hit_local;
  ray *ray_local;
  
  b = sub_vec3(*&(tri->p0)._,*&(ray->org)._);
  a = cross_vec3(*&(ray->dir)._,b);
  rVar1 = dot_vec3((vec3)*&(tri->n)._,(vec3)*&(ray->dir)._);
  fVar2 = 1.0 / rVar1;
  rVar1 = dot_vec3(a,(vec3)*&(tri->e2)._);
  x = rVar1 * fVar2;
  rVar1 = dot_vec3(a,(vec3)*&(tri->e1)._);
  y = rVar1 * fVar2;
  if (((0.0 <= x) && (0.0 <= y)) && (x + y <= 1.0)) {
    rVar1 = dot_vec3((vec3)*&(tri->n)._,b);
    fVar2 = rVar1 * fVar2;
    if ((ray->t_min <= fVar2) && (fVar2 <= ray->t_max)) {
      ray->t_max = fVar2;
      vVar3 = make_vec2(x,y);
      *&(hit->uv)._ = vVar3._;
      return true;
    }
  }
  return false;
}

Assistant:

bool intersect_ray_tri(struct ray* ray, struct hit* hit, const struct tri* tri) {
    struct vec3 c = sub_vec3(tri->p0, ray->org);
    struct vec3 r = cross_vec3(ray->dir, c);

    real_t inv_det = ((real_t)1) / dot_vec3(tri->n, ray->dir);
    real_t u = dot_vec3(r, tri->e2) * inv_det;
    real_t v = dot_vec3(r, tri->e1) * inv_det;

    // These comparisons are designed to return false
    // when one of t, u, or v is a NaN
    if (u >= 0 && v >= 0 && u + v <= 1) {
        real_t t = dot_vec3(tri->n, c) * inv_det;
        if (t >= ray->t_min && t <= ray->t_max) {
            ray->t_max = t;
            hit->uv = make_vec2(u, v);
            return true;
        }
    }

    return false;
}